

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void * vmd_stack_push(vmd_stack_t *set,void *data)

{
  int iVar1;
  vmd_stack_block_t *pvVar2;
  void *__dest;
  void *ret;
  vmd_stack_block_t *head;
  void *data_local;
  vmd_stack_t *set_local;
  
  if ((set->head == (vmd_stack_block_t *)0x0) || (set->head->used == 0x400)) {
    pvVar2 = (vmd_stack_block_t *)malloc(set->dsize * 0x400 + 0x10);
    pvVar2->next = set->head;
    pvVar2->used = 0;
    set->head = pvVar2;
  }
  pvVar2 = set->head;
  iVar1 = set->head->used;
  set->head->used = iVar1 + 1;
  __dest = &pvVar2->field_0xc + (long)iVar1 * set->dsize;
  if (data != (void *)0x0) {
    memcpy(__dest,data,set->dsize);
  }
  return __dest;
}

Assistant:

void *
stack_push(stack_t *set, const void *data)
{
	if (set->head == NULL || set->head->used == BLOCK_SIZE) {
		stack_block_t *head = malloc(sizeof(stack_block_t) + set->dsize * BLOCK_SIZE);

		head->next = set->head;
		head->used = 0;

		set->head = head;
	}

	void *ret = set->head->data + (set->head->used++) * set->dsize;
	if (data)
		memcpy(ret, data, set->dsize);
	return ret;
}